

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O2

void __thiscall QIconModeViewBase::moveItem(QIconModeViewBase *this,int index,QPoint *dest)

{
  pointer pQVar1;
  QSize QVar2;
  char *pcVar3;
  long i;
  long in_FS_OFFSET;
  undefined1 auVar4 [16];
  QPoint local_68;
  undefined8 uStack_60;
  QPoint local_58;
  Representation local_50;
  Representation RStack_4c;
  QRect local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  i = (long)index;
  pQVar1 = QList<QListViewItem>::data(&this->items);
  local_48 = QListViewItem::rect(pQVar1 + i);
  QBspTree::removeLeaf(&this->tree,&local_48,index);
  local_58 = *dest;
  pQVar1[i].x = local_58.xp.m_i;
  pQVar1[i].y = local_58.yp.m_i;
  RStack_4c.m_i = (local_48.y2.m_i - local_48.y1.m_i) + local_58.yp.m_i.m_i;
  local_50.m_i = (local_48.x2.m_i - local_48.x1.m_i) + local_58.xp.m_i.m_i;
  QBspTree::insertLeaf(&this->tree,(QRect *)&local_58,index);
  local_58.xp.m_i = 0;
  local_58.yp.m_i = 0;
  QVar2 = (this->super_QCommonListViewBase).contentsSize;
  local_50.m_i = QVar2.wd.m_i.m_i + -1;
  RStack_4c.m_i = QVar2.ht.m_i.m_i + -1;
  local_68 = *dest;
  uStack_60._0_4_ = (local_48.x2.m_i.m_i - local_48.x1.m_i) + local_68.xp.m_i.m_i;
  uStack_60._4_4_ = (local_48.y2.m_i.m_i - local_48.y1.m_i) + local_68.yp.m_i.m_i;
  auVar4 = QRect::operator|((QRect *)&local_58,(QRect *)&local_68);
  QVar2.wd.m_i = (auVar4._8_4_ - auVar4._0_4_) + 1;
  QVar2.ht.m_i = (auVar4._12_4_ - auVar4._4_4_) + 1;
  (this->super_QCommonListViewBase).contentsSize = QVar2;
  pcVar3 = (this->moved).d.d.ptr;
  if (pcVar3 == (char *)0x0) {
    pcVar3 = (char *)&QByteArray::_empty;
  }
  if ((this->moved).d.d.size * 8 - (long)*pcVar3 != (this->items).d.size) {
    QBitArray::resize((longlong)&this->moved);
  }
  QBitArray::setBit(&this->moved,i);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QIconModeViewBase::moveItem(int index, const QPoint &dest)
{
    // does not impact on the bintree itself or the contents rect
    QListViewItem *item = &items[index];
    QRect rect = item->rect();

    // move the item without removing it from the tree
    tree.removeLeaf(rect, index);
    item->move(dest);
    tree.insertLeaf(QRect(dest, rect.size()), index);

    // resize the contents area
    contentsSize = (QRect(QPoint(0, 0), contentsSize)|QRect(dest, rect.size())).size();

    // mark the item as moved
    if (moved.size() != items.size())
        moved.resize(items.size());
    moved.setBit(index, true);
}